

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O0

void __thiscall cppjit::builder::builder::builder(builder *this,builder *other)

{
  allocator local_25 [13];
  builder *local_18;
  builder *other_local;
  builder *this_local;
  
  this->_vptr_builder = (_func_int **)&PTR___cxa_pure_virtual_0010cd78;
  local_18 = other;
  other_local = this;
  std::__cxx11::string::string((string *)&this->kernel_name,(string *)&other->kernel_name);
  this->verbose = (bool)(local_18->verbose & 1);
  this->do_cleanup = true;
  this->has_source_ = (bool)(local_18->has_source_ & 1);
  this->has_inline_source_ = (bool)(local_18->has_inline_source_ & 1);
  std::__cxx11::string::string((string *)&this->source,(string *)&local_18->source);
  std::__cxx11::string::string((string *)&this->source_dir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->compile_dir,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->compile_dir_created = false;
  this->kernel_library = (void *)0x0;
  if ((local_18->has_inline_source_ & 1U) == 0) {
    std::__cxx11::string::operator=((string *)&this->source_dir,(string *)&local_18->source_dir);
  }
  return;
}

Assistant:

builder(const builder &other)
      : kernel_name(other.kernel_name),
        verbose(other.verbose),
        do_cleanup(true),
        has_source_(other.has_source_),
        has_inline_source_(other.has_inline_source_),
        source(other.source),
        compile_dir(""),
        compile_dir_created(false),
        kernel_library(nullptr) {
    if (!other.has_inline_source_) {
      source_dir = other.source_dir;
    }
  }